

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# event.cpp
# Opt level: O1

HANDLE OpenEventW(DWORD dwDesiredAccess,BOOL bInheritHandle,LPCWSTR lpName)

{
  void *pvVar1;
  int *piVar2;
  int iVar3;
  
  if (PAL_InitializeChakraCoreCalled) {
    pvVar1 = pthread_getspecific(CorUnix::thObjKey);
    if (pvVar1 == (void *)0x0) {
      CreateCurrentThreadData();
    }
    if (lpName == (LPCWSTR)0x0) {
      iVar3 = 0x57;
      if (PAL_InitializeChakraCoreCalled == false) goto LAB_002c92c0;
    }
    else {
      fprintf(_stderr,"] %s %s:%d","OpenEventW",
              "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/synchobj/event.cpp"
              ,0x1ee);
      fprintf(_stderr,"lpName: Cross-process named objects are not supported in PAL");
      iVar3 = 0x32;
    }
    piVar2 = __errno_location();
    *piVar2 = iVar3;
    if (PAL_InitializeChakraCoreCalled != false) {
      return (HANDLE)0x0;
    }
  }
LAB_002c92c0:
  abort();
}

Assistant:

HANDLE
PALAPI
OpenEventW(
       IN DWORD dwDesiredAccess,
       IN BOOL bInheritHandle,
       IN LPCWSTR lpName)
{
    HANDLE hEvent = NULL;
    PAL_ERROR palError = NO_ERROR;
    CPalThread *pthr = NULL;

    PERF_ENTRY(OpenEventW);
    ENTRY("OpenEventW(dwDesiredAccess=%#x, bInheritHandle=%d, lpName=%p (%S))\n", 
          dwDesiredAccess, bInheritHandle, lpName, lpName?lpName:W16_NULLSTRING);

    pthr = InternalGetCurrentThread();

    /* validate parameters */
    if (lpName == nullptr)
    {
        ERROR("name is NULL\n");
        palError = ERROR_INVALID_PARAMETER;
        goto OpenEventWExit;            
    }
    else
    {
        ASSERT("lpName: Cross-process named objects are not supported in PAL");
        palError = ERROR_NOT_SUPPORTED;
    }

OpenEventWExit:

    if (NO_ERROR != palError)
    {
        pthr->SetLastError(palError);
    }

    LOGEXIT("OpenEventW returns HANDLE %p\n", hEvent);
    PERF_EXIT(OpenEventW);

    return hEvent;
}